

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.cpp
# Opt level: O2

void __thiscall
HighsImplications::rebuild
          (HighsImplications *this,HighsInt ncols,vector<int,_std::allocator<int>_> *orig2reducedcol
          ,vector<int,_std::allocator<int>_> *orig2reducedrow)

{
  vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_> *this_00;
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  *pvVar1;
  pointer puVar2;
  pointer pHVar3;
  pointer pHVar4;
  pointer pHVar5;
  HighsInt HVar6;
  ulong uVar7;
  size_type __new_size;
  HighsInt newi;
  int local_7c;
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  local_78;
  anon_class_24_3_68744407 local_60;
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  local_48;
  
  local_48.
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->vlbs).
       super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->vlbs).
       super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->vlbs).
       super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->vlbs).
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vlbs).
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vlbs).
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->vubs).
       super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->vubs).
       super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->vubs).
       super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->vubs).
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vubs).
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vubs).
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar2 = (this->colsubstituted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->colsubstituted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->colsubstituted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish = puVar2;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_shrink_to_fit
            (&this->colsubstituted);
  this_00 = &this->implications;
  std::vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>::clear
            (this_00);
  std::vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>::
  _M_shrink_to_fit(this_00);
  std::vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>::resize
            (this_00,(long)(ncols * 2));
  __new_size = (size_type)ncols;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->colsubstituted,__new_size);
  pvVar1 = &this->vubs;
  pHVar3 = (this->substitutions).
           super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->substitutions).
      super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>._M_impl.
      super__Vector_impl_data._M_finish != pHVar3) {
    (this->substitutions).super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar3;
  }
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::clear(pvVar1);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::_M_shrink_to_fit(pvVar1);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::resize(pvVar1,__new_size);
  pvVar1 = &this->vlbs;
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::clear(pvVar1);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::_M_shrink_to_fit(pvVar1);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::resize(pvVar1,__new_size);
  pHVar5 = local_78.
           super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pHVar4 = local_78.
           super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this->numImplications = 0;
  HVar6 = HighsMipSolver::numNonzero(this->mipsolver);
  this->nextCleanupCall = HVar6;
  for (uVar7 = 0; ((ulong)((long)pHVar5 - (long)pHVar4) >> 3 & 0xffffffff) != uVar7;
      uVar7 = uVar7 + 1) {
    local_7c = (orig2reducedcol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar7];
    if (((long)local_7c != -1) &&
       (*(char *)(*(long *)&(((this->mipsolver->mipdata_)._M_t.
                              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                            postSolveStack).linearlyTransformable.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl + (long)local_7c) != '\0')) {
      local_60.orig2reducedcol = orig2reducedcol;
      local_60.this = this;
      local_60.newi = &local_7c;
      HighsHashTree<int,_HighsImplications::VarBound>::
      for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsImplications_cpp:483:25)_&,_0>
                ((NodePtr)local_78.
                          super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7].root.ptrAndType,&local_60
                );
      local_60.orig2reducedcol = orig2reducedcol;
      local_60.this = this;
      local_60.newi = &local_7c;
      HighsHashTree<int,_HighsImplications::VarBound>::
      for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsImplications_cpp:495:25)_&,_0>
                ((NodePtr)local_48.
                          super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7].root.ptrAndType,&local_60
                );
    }
  }
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::~vector(&local_48);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void HighsImplications::rebuild(HighsInt ncols,
                                const std::vector<HighsInt>& orig2reducedcol,
                                const std::vector<HighsInt>& orig2reducedrow) {
  std::vector<HighsHashTree<HighsInt, VarBound>> oldvubs;
  std::vector<HighsHashTree<HighsInt, VarBound>> oldvlbs;

  oldvlbs.swap(vlbs);
  oldvubs.swap(vubs);

  colsubstituted.clear();
  colsubstituted.shrink_to_fit();
  implications.clear();
  implications.shrink_to_fit();

  implications.resize(2 * ncols);
  colsubstituted.resize(ncols);
  substitutions.clear();
  vubs.clear();
  vubs.shrink_to_fit();
  vubs.resize(ncols);
  vlbs.clear();
  vlbs.shrink_to_fit();
  vlbs.resize(ncols);
  numImplications = 0;
  HighsInt oldncols = oldvubs.size();

  nextCleanupCall = mipsolver.numNonzero();

  for (HighsInt i = 0; i != oldncols; ++i) {
    HighsInt newi = orig2reducedcol[i];

    if (newi == -1 ||
        !mipsolver.mipdata_->postSolveStack.isColLinearlyTransformable(newi))
      continue;

    oldvubs[i].for_each([&](HighsInt vubCol, VarBound vub) {
      HighsInt newVubCol = orig2reducedcol[vubCol];
      if (newVubCol == -1) return;

      if (!mipsolver.mipdata_->domain.isBinary(newVubCol) ||
          !mipsolver.mipdata_->postSolveStack.isColLinearlyTransformable(
              newVubCol))
        return;

      addVUB(newi, newVubCol, vub.coef, vub.constant);
    });

    oldvlbs[i].for_each([&](HighsInt vlbCol, VarBound vlb) {
      HighsInt newVlbCol = orig2reducedcol[vlbCol];
      if (newVlbCol == -1) return;

      if (!mipsolver.mipdata_->domain.isBinary(newVlbCol) ||
          !mipsolver.mipdata_->postSolveStack.isColLinearlyTransformable(
              newVlbCol))
        return;

      addVLB(newi, newVlbCol, vlb.coef, vlb.constant);
    });

    // todo also add old implications once implications can be added
    // incrementally for now we discard the old implications as they might be
    // weaker then newly computed ones and adding them would block computation
    // of new implications
  }
}